

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::ActualConfigure(cmake *this)

{
  unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  pointer pcVar4;
  cmState *pcVar5;
  cmGlobalGenerator *pcVar6;
  size_t sVar7;
  cmFileAPI *__ptr;
  cmMakefile *this_01;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ProjectKind PVar12;
  string *psVar13;
  cmValue cVar14;
  Status SVar15;
  cmValue cVar16;
  cmFileAPI *this_02;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  pointer __p;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string message_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char local_150;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  string message;
  string redirectsDir;
  long *local_50 [2];
  long local_40 [2];
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  psVar13 = cmState::GetBinaryDirectory_abi_cxx11_
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  paVar1 = &__str.field_2;
  pcVar4 = (psVar13->_M_dataplus)._M_p;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,pcVar4,pcVar4 + psVar13->_M_string_length);
  std::__cxx11::string::append((char *)&__str);
  cmsys::SystemTools::RemoveADirectory(&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  iVar10 = DoPreConfigureChecks(this);
  if (iVar10 < 0) {
    return -2;
  }
  if (iVar10 == 0) {
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_HOME_DIRECTORY","");
    cVar14.Value = cmState::GetSourceDirectory_abi_cxx11_
                             ((this->State)._M_t.
                              super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                              super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    message_4._M_dataplus._M_p = (pointer)&message_4.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&message_4,
               "Source directory with the top level CMakeLists.txt file for this project","");
    AddCacheEntry(this,&__str,cVar14,&message_4,4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_4._M_dataplus._M_p != &message_4.field_2) {
      operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
  }
  psVar13 = cmState::GetBinaryDirectory_abi_cxx11_
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  __str._M_string_length = (size_type)(psVar13->_M_dataplus)._M_p;
  __str._M_dataplus._M_p = (pointer)psVar13->_M_string_length;
  __str.field_2._M_allocated_capacity = 0;
  __str.field_2._8_8_ = 0x18;
  local_150 = -0x2c;
  views._M_len = 2;
  views._M_array = (iterator)&__str;
  cmCatViews(&redirectsDir,views);
  cmsys::SystemTools::RemoveADirectory(&redirectsDir);
  SVar15 = cmsys::SystemTools::MakeDirectory(&redirectsDir,(mode_t *)0x0);
  if (SVar15.Kind_ != Success) {
    __str._M_dataplus._M_p = (pointer)0x3b;
    __str._M_string_length = (size_type)anon_var_dwarf_c3eacc;
    __str.field_2._M_allocated_capacity = 0;
    __str.field_2._8_8_ = redirectsDir._M_string_length;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&__str;
    cmCatViews(&message_4,views_00);
    cmSystemTools::Error(&message_4);
    uVar17 = message_4.field_2._M_allocated_capacity;
    _Var18 = message_4._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_4._M_dataplus._M_p != &message_4.field_2) {
LAB_0030ea71:
      operator_delete(_Var18._M_p,uVar17 + 1);
    }
LAB_0030ea79:
    iVar10 = -1;
    goto LAB_0030ea7e;
  }
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__str,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR","");
  paVar2 = &message_4.field_2;
  message_4._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&message_4,"Value Computed by CMake.","");
  AddCacheEntry(this,&__str,&redirectsDir,&message_4,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message_4._M_dataplus._M_p != paVar2) {
    operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0) {
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_GENERATOR","");
    cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_EXTRA_GENERATOR","");
    cVar16 = cmState::GetInitializedCacheValue(pcVar5,&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (cVar14.Value != (string *)0x0) {
      if (cVar16.Value == (string *)0x0) {
        message_4._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&message_4,"");
      }
      else {
        pcVar4 = ((cVar16.Value)->_M_dataplus)._M_p;
        message_4._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&message_4,pcVar4,pcVar4 + (cVar16.Value)->_M_string_length);
      }
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&__str,cVar14.Value,&message_4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)message_4._M_dataplus._M_p != paVar2) {
        operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
      }
      CreateGlobalGenerator((cmake *)&message_4,(string *)this,SUB81(&__str,0));
      _Var18 = message_4._M_dataplus;
      message_4._M_dataplus._M_p = (pointer)0x0;
      pcVar6 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
           (cmGlobalGenerator *)_Var18._M_p;
      if (pcVar6 != (cmGlobalGenerator *)0x0) {
        (*pcVar6->_vptr_cmGlobalGenerator[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar6 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    if (pcVar6 == (cmGlobalGenerator *)0x0) {
      CreateDefaultGlobalGenerator(this);
    }
    else {
      cmSystemTools::s_ForceUnixPaths = pcVar6->ForceUnixPaths;
    }
    if ((this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0)
    {
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str,"Could not create generator","");
      cmSystemTools::Error(&__str);
      uVar17 = __str.field_2._M_allocated_capacity;
      _Var18 = __str._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) goto LAB_0030ea71;
      goto LAB_0030ea79;
    }
  }
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_GENERATOR","");
  cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if (cVar14.Value == (string *)0x0) {
LAB_0030ed30:
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_GENERATOR","");
    (*((this->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[3])
              (&message_4);
    puVar3 = local_c8 + 0x10;
    local_c8._0_8_ = puVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Name of generator.","");
    AddCacheEntry(this,&__str,&message_4,(string *)local_c8,4);
    if ((undefined1 *)local_c8._0_8_ != puVar3) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_4._M_dataplus._M_p != paVar2) {
      operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_EXTRA_GENERATOR","");
    cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
              (&message_4,
               (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
    local_c8._0_8_ = puVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Name of external makefile project generator.","");
    AddCacheEntry(this,&__str,&message_4,(string *)local_c8,4);
    if ((undefined1 *)local_c8._0_8_ != puVar3) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_4._M_dataplus._M_p != paVar2) {
      operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_TOOLCHAIN_FILE","");
    cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (cVar14.Value == (string *)0x0) {
      __str._M_string_length = 0;
      __str.field_2._M_allocated_capacity = __str.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      __str._M_dataplus._M_p = (pointer)paVar1;
      bVar8 = cmsys::SystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE",&__str);
      if (bVar8 && __str._M_string_length != 0) {
        message_4._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&message_4,"CMAKE_TOOLCHAIN_FILE","");
        local_c8._0_8_ = puVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,"The CMake toolchain file","");
        AddCacheEntry(this,&message_4,&__str,(string *)local_c8,2);
        if ((undefined1 *)local_c8._0_8_ != puVar3) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_b8[0]._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)message_4._M_dataplus._M_p != paVar2) {
          operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pcVar6 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    iVar10 = (*pcVar6->_vptr_cmGlobalGenerator[4])(pcVar6,cVar14.Value);
    if ((char)iVar10 == '\0') {
      (*((this->GlobalGenerator)._M_t.
         super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
         super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
         super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[3]
      )(local_50);
      __str._M_dataplus._M_p = (pointer)0x13;
      __str._M_string_length = (size_type)anon_var_dwarf_c3eb36;
      __str.field_2._M_allocated_capacity = 0;
      __str.field_2._8_8_ = local_50[1];
      message_4.field_2._M_allocated_capacity = (long)&message_4.field_2 + 8;
      message_4._M_dataplus._M_p = (pointer)0x0;
      message_4._M_string_length = 1;
      message_4.field_2._M_local_buf[8] = '\n';
      local_b8[0]._0_8_ = local_c8 + 0x18;
      local_c8._0_8_ = (undefined1 *)0x0;
      local_c8._8_8_ = &DAT_00000001;
      local_b8[0]._M_local_buf[8] = '\n';
      views_02._M_len = 7;
      views_02._M_array = (iterator)&__str;
      cmCatViews(&message,views_02);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      cmSystemTools::Error(&message);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)message._M_dataplus._M_p != &message.field_2) {
        operator_delete(message._M_dataplus._M_p,message.field_2._M_allocated_capacity + 1);
      }
      iVar10 = -2;
      goto LAB_0030ea7e;
    }
    if (cVar14.Value == (string *)0x0) goto LAB_0030ed30;
  }
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  __str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_GENERATOR_INSTANCE","");
  cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar1) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if (cVar14.Value == (string *)0x0) {
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_GENERATOR_INSTANCE","");
    message_4._M_dataplus._M_p = (pointer)&message_4.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&message_4,"Generator instance identifier.","");
    AddCacheEntry(this,&__str,(cmValue)&this->GeneratorInstance,&message_4,4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_4._M_dataplus._M_p != &message_4.field_2) {
      operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    iVar10 = -1;
    bVar8 = true;
  }
  else {
    iVar10 = -1;
    bVar8 = true;
    if ((this->GeneratorInstanceSet == true) &&
       ((sVar7 = (this->GeneratorInstance)._M_string_length,
        sVar7 != (cVar14.Value)->_M_string_length ||
        ((sVar7 != 0 &&
         (iVar11 = bcmp((this->GeneratorInstance)._M_dataplus._M_p,
                        ((cVar14.Value)->_M_dataplus)._M_p,sVar7), iVar11 != 0)))))) {
      __str._M_dataplus._M_p = (pointer)0x1b;
      __str._M_string_length = (size_type)anon_var_dwarf_c3eba0;
      __str.field_2._M_allocated_capacity = 0;
      local_150 = (char)(this->GeneratorInstance)._M_dataplus._M_p;
      message_4.field_2._M_allocated_capacity = (long)&message_4.field_2 + 8;
      message_4._M_dataplus._M_p = (pointer)0x0;
      message_4._M_string_length = 1;
      message_4.field_2._M_local_buf[8] = '\n';
      local_b8[0]._0_8_ = local_c8 + 0x18;
      local_c8._0_8_ = (undefined1 *)0x0;
      local_c8._8_8_ = &DAT_00000001;
      local_b8[0]._M_local_buf[8] = '\n';
      views_01._M_len = 7;
      views_01._M_array = (iterator)&__str;
      __str.field_2._8_8_ = sVar7;
      cmCatViews(&message,views_01);
      cmSystemTools::Error(&message);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)message._M_dataplus._M_p != &message.field_2) {
        operator_delete(message._M_dataplus._M_p,message.field_2._M_allocated_capacity + 1);
      }
      iVar10 = -2;
      bVar8 = false;
    }
  }
  if (bVar8) {
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_GENERATOR_PLATFORM","");
    cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (cVar14.Value == (string *)0x0) {
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str,"CMAKE_GENERATOR_PLATFORM","");
      message_4._M_dataplus._M_p = (pointer)&message_4.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&message_4,"Name of generator platform.","");
      AddCacheEntry(this,&__str,(cmValue)&this->GeneratorPlatform,&message_4,4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)message_4._M_dataplus._M_p != &message_4.field_2) {
        operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      bVar8 = true;
    }
    else {
      bVar8 = true;
      if (this->GeneratorPlatformSet == true) {
        sVar7 = (this->GeneratorPlatform)._M_string_length;
        if ((sVar7 != (cVar14.Value)->_M_string_length) ||
           ((sVar7 != 0 &&
            (iVar11 = bcmp((this->GeneratorPlatform)._M_dataplus._M_p,
                           ((cVar14.Value)->_M_dataplus)._M_p,sVar7), iVar11 != 0)))) {
          message_4._M_dataplus._M_p._0_1_ = 10;
          local_c8[0] = 10;
          cmStrCat<char_const(&)[28],std::__cxx11::string&,char,char_const(&)[46],std::__cxx11::string_const&,char,char_const(&)[103]>
                    (&__str,(char (*) [28])"Error: generator platform: ",&this->GeneratorPlatform,
                     (char *)&message_4,
                     (char (*) [46])"Does not match the platform used previously: ",cVar14.Value,
                     local_c8,(char (*) [103])
                              "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          iVar10 = -2;
          bVar8 = false;
        }
      }
    }
    if (bVar8) {
      pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_GENERATOR_TOOLSET","")
      ;
      cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if (cVar14.Value == (string *)0x0) {
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__str,"CMAKE_GENERATOR_TOOLSET","");
        message_4._M_dataplus._M_p = (pointer)&message_4.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&message_4,"Name of generator toolset.","");
        AddCacheEntry(this,&__str,(cmValue)&this->GeneratorToolset,&message_4,4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)message_4._M_dataplus._M_p != &message_4.field_2) {
          operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        bVar8 = true;
      }
      else {
        bVar8 = true;
        if (this->GeneratorToolsetSet == true) {
          bVar9 = std::operator!=(&this->GeneratorToolset,cVar14.Value);
          if (bVar9) {
            message_4._M_dataplus._M_p._0_1_ = 10;
            local_c8[0] = 10;
            cmStrCat<char_const(&)[27],std::__cxx11::string&,char,char_const(&)[45],std::__cxx11::string_const&,char,char_const(&)[103]>
                      (&__str,(char (*) [27])"Error: generator toolset: ",&this->GeneratorToolset,
                       (char *)&message_4,
                       (char (*) [45])"Does not match the toolset used previously: ",cVar14.Value,
                       local_c8,(char (*) [103])
                                "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                      );
            cmSystemTools::Error(&__str);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != paVar1) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            iVar10 = -2;
            bVar8 = false;
          }
        }
      }
      if (bVar8) {
        pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_TEST_LAUNCHER","");
        cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
        paVar2 = &message_4.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if (cVar14.Value == (string *)0x0) {
          message_4._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&message_4,"CMAKE_TEST_LAUNCHER","");
          cmSystemTools::GetEnvVar
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&__str,&message_4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)message_4._M_dataplus._M_p != paVar2) {
            operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
          }
          if ((local_150 == '\x01') && (__str._M_string_length != 0)) {
            message_4._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&message_4,"Test launcher to run tests executable.","");
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"CMAKE_TEST_LAUNCHER","");
            AddCacheEntry(this,(string *)local_c8,&__str,&message_4,3);
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_,(ulong)(local_b8[0]._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)message_4._M_dataplus._M_p != paVar2) {
              operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((local_150 == '\x01') &&
             (local_150 = '\0',
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__str._M_dataplus._M_p != paVar1)) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__str,"CMAKE_CROSSCOMPILING_EMULATOR","");
        cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if (cVar14.Value == (string *)0x0) {
          message_4._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&message_4,"CMAKE_CROSSCOMPILING_EMULATOR","");
          cmSystemTools::GetEnvVar
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&__str,&message_4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)message_4._M_dataplus._M_p != paVar2) {
            operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
          }
          if ((local_150 == '\x01') && (__str._M_string_length != 0)) {
            message_4._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&message_4,
                       "Emulator to run executables and tests when cross compiling.","");
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"CMAKE_CROSSCOMPILING_EMULATOR","");
            AddCacheEntry(this,(string *)local_c8,&__str,&message_4,3);
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_,(ulong)(local_b8[0]._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)message_4._M_dataplus._M_p != paVar2) {
              operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((local_150 == '\x01') &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1)) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
        }
        PVar12 = cmState::GetProjectKind
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        if (PVar12 != TryCompile) {
          cmGlobalGenerator::ClearEnabledLanguages
                    ((this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
        }
        this_02 = (cmFileAPI *)operator_new(0x108);
        cmFileAPI::cmFileAPI(this_02,this);
        this_00 = &this->FileAPI;
        __str._M_dataplus._M_p = (pointer)0x0;
        __ptr = (this->FileAPI)._M_t.
                super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
                super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
                super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl;
        (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
        super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
        super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = this_02;
        if (__ptr != (cmFileAPI *)0x0) {
          std::default_delete<cmFileAPI>::operator()((default_delete<cmFileAPI> *)this_00,__ptr);
        }
        if (__str._M_dataplus._M_p != (pointer)0x0) {
          std::default_delete<cmFileAPI>::operator()
                    ((default_delete<cmFileAPI> *)&__str,(cmFileAPI *)__str._M_dataplus._M_p);
        }
        cmFileAPI::ReadQueries
                  ((this_00->_M_t).super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>
                   ._M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
                   super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
        PVar12 = cmState::GetProjectKind
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        if (PVar12 != TryCompile) {
          TruncateOutputLog(this,"CMakeConfigureLog.yaml");
          psVar13 = cmState::GetBinaryDirectory_abi_cxx11_
                              ((this->State)._M_t.
                               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                               super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
          local_c8._0_8_ = (undefined1 *)0xb;
          local_c8._8_8_ = "/CMakeFiles";
          cmStrCat<std::__cxx11::string_const&,cm::static_string_view>
                    (&__str,psVar13,(static_string_view *)local_c8);
          cmFileAPI::GetConfigureLogVersions
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&message_4,
                     (this_00->_M_t).
                     super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
                     super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
                     super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
          std::
          make_unique<cmConfigureLog,std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    (&message,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__str);
          _Var18 = message._M_dataplus;
          message._M_dataplus._M_p = (pointer)0x0;
          std::__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::reset
                    ((__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)
                     &this->ConfigureLog,(pointer)_Var18._M_p);
          std::unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::~unique_ptr
                    ((unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)&message);
          if (message_4._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(message_4._M_dataplus._M_p,
                            message_4.field_2._M_allocated_capacity -
                            (long)message_4._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
        }
        (*((this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator
          [0xc])();
        std::__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::reset
                  ((__uniq_ptr_impl<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)
                   &this->ConfigureLog,(pointer)0x0);
        pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__str,"CMAKE_BACKWARDS_COMPATIBILITY","");
        cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if (cVar14.Value != (string *)0x0) {
          pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          __str._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"LIBRARY_OUTPUT_PATH","")
          ;
          cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (cVar14.Value == (string *)0x0) {
            __str._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&__str,"LIBRARY_OUTPUT_PATH","");
            message_4._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&message_4,"");
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"Single output directory for building all libraries.","");
            AddCacheEntry(this,&__str,&message_4,(string *)local_c8,1);
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_,(ulong)(local_b8[0]._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)message_4._M_dataplus._M_p != paVar2) {
              operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != paVar1) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          __str._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__str,"EXECUTABLE_OUTPUT_PATH","");
          cVar14 = cmState::GetInitializedCacheValue(pcVar5,&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (cVar14.Value == (string *)0x0) {
            __str._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&__str,"EXECUTABLE_OUTPUT_PATH","");
            message_4._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&message_4,"");
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"Single output directory for building all executables.",""
                      );
            AddCacheEntry(this,&__str,&message_4,(string *)local_c8,1);
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_,(ulong)(local_b8[0]._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)message_4._M_dataplus._M_p != paVar2) {
              operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != paVar1) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
          }
        }
        this_01 = (cmMakefile *)
                  **(undefined8 **)
                    &(((this->GlobalGenerator)._M_t.
                       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                       .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->Makefiles).
                     super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                     ._M_impl;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CTEST_USE_LAUNCHERS","");
        bVar8 = cmMakefile::IsOn(this_01,&__str);
        if (bVar8) {
          pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          message_4._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&message_4,"RULE_LAUNCH_COMPILE","");
          cVar14 = cmState::GetGlobalProperty(pcVar5,&message_4);
          bVar8 = cVar14.Value == (string *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)message_4._M_dataplus._M_p != paVar2) {
            operator_delete(message_4._M_dataplus._M_p,message_4.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar8 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) {
          __str._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__str,
                     "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                     ,"");
          cmSystemTools::Error(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        psVar13 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar5);
        cmState::SaveVerificationScript
                  (pcVar5,psVar13,
                   (this->Messenger)._M_t.
                   super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                   super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                   super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl);
        psVar13 = cmState::GetBinaryDirectory_abi_cxx11_
                            ((this->State)._M_t.
                             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        SaveCache(this,psVar13);
        bVar8 = true;
        if ((cmSystemTools::s_ErrorOccurred == false) &&
           (cmSystemTools::s_FatalErrorOccurred == false)) {
          bVar8 = cmSystemTools::GetInterruptFlag();
        }
        iVar10 = -(uint)bVar8;
      }
    }
  }
LAB_0030ea7e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)redirectsDir._M_dataplus._M_p != &redirectsDir.field_2) {
    operator_delete(redirectsDir._M_dataplus._M_p,redirectsDir.field_2._M_allocated_capacity + 1);
  }
  return iVar10;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  cmSystemTools::RemoveADirectory(this->GetHomeOutputDirectory() +
                                  "/CMakeFiles/CMakeScratch");

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // We want to create the package redirects directory as early as possible,
  // but not before pre-configure checks have passed. This ensures we get
  // errors about inappropriate source/binary directories first.
  const auto redirectsDir =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles/pkgRedirects");
  cmSystemTools::RemoveADirectory(redirectsDir);
  if (!cmSystemTools::MakeDirectory(redirectsDir)) {
    cmSystemTools::Error(
      cmStrCat("Unable to (re)create the private pkgRedirects directory:\n  ",
               redirectsDir,
               "\n"
               "This may be caused by not having read/write access to "
               "the build directory.\n"
               "Try specifying a location with read/write access like:\n"
               "  cmake -B build\n"
               "If using a CMake presets file, ensure that preset parameter\n"
               "'binaryDir' expands to a writable directory.\n"));
    return -1;
  }
  this->AddCacheEntry("CMAKE_FIND_PACKAGE_REDIRECTS_DIR", redirectsDir,
                      "Value Computed by CMake.", cmStateEnums::STATIC);

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    cmValue extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message = cmStrCat(
        "Error: generator : ", this->GlobalGenerator->GetName(), '\n',
        "Does not match the generator used previously: ", *genName, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!genName) {
    this->AddCacheEntry("CMAKE_GENERATOR", this->GlobalGenerator->GetName(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry(
      "CMAKE_EXTRA_GENERATOR", this->GlobalGenerator->GetExtraGeneratorName(),
      "Name of external makefile project generator.", cmStateEnums::INTERNAL);

    if (!this->State->GetInitializedCacheValue("CMAKE_TOOLCHAIN_FILE")) {
      std::string envToolchain;
      if (cmSystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE", envToolchain) &&
          !envToolchain.empty()) {
        this->AddCacheEntry("CMAKE_TOOLCHAIN_FILE", envToolchain,
                            "The CMake toolchain file",
                            cmStateEnums::FILEPATH);
      }
    }
  }

  if (cmValue instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message = cmStrCat(
        "Error: generator instance: ", this->GeneratorInstance, '\n',
        "Does not match the instance used previously: ", *instance, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance,
                        "Generator instance identifier.",
                        cmStateEnums::INTERNAL);
  }

  if (cmValue platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = cmStrCat(
        "Error: generator platform: ", this->GeneratorPlatform, '\n',
        "Does not match the platform used previously: ", *platformName, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform,
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (cmValue tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message =
        cmStrCat("Error: generator toolset: ", this->GeneratorToolset, '\n',
                 "Does not match the toolset used previously: ", *tsName, '\n',
                 "Either remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset,
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  if (!this->State->GetInitializedCacheValue("CMAKE_TEST_LAUNCHER")) {
    cm::optional<std::string> testLauncher =
      cmSystemTools::GetEnvVar("CMAKE_TEST_LAUNCHER");
    if (testLauncher && !testLauncher->empty()) {
      std::string message = "Test launcher to run tests executable.";
      this->AddCacheEntry("CMAKE_TEST_LAUNCHER", *testLauncher, message,
                          cmStateEnums::STRING);
    }
  }

  if (!this->State->GetInitializedCacheValue(
        "CMAKE_CROSSCOMPILING_EMULATOR")) {
    cm::optional<std::string> emulator =
      cmSystemTools::GetEnvVar("CMAKE_CROSSCOMPILING_EMULATOR");
    if (emulator && !emulator->empty()) {
      std::string message =
        "Emulator to run executables and tests when cross compiling.";
      this->AddCacheEntry("CMAKE_CROSSCOMPILING_EMULATOR", *emulator, message,
                          cmStateEnums::STRING);
    }
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();
  }

#if !defined(CMAKE_BOOTSTRAP)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();

  if (!this->GetIsInTryCompile()) {
    this->TruncateOutputLog("CMakeConfigureLog.yaml");
    this->ConfigureLog = cm::make_unique<cmConfigureLog>(
      cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles"_s),
      this->FileAPI->GetConfigureLogVersions());
  }
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();

#if !defined(CMAKE_BOOTSTRAP)
  this->ConfigureLog.reset();
#endif

  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  const auto& mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory(),
                                      this->Messenger.get());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  return 0;
}